

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
               (DataStream *s,CompactSizeWriter *args,Span<const_unsigned_char> *args_1)

{
  DataStream *in_RDX;
  CompactSizeWriter *in_RDI;
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  Span<const_unsigned_char> *args_1_00;
  CompactSizeWriter *in_stack_ffffffffffffffd0;
  Span<const_unsigned_char> local_10;
  
  local_10.m_size = *(size_t *)(in_FS_OFFSET + 0x28);
  args_1_00 = &local_10;
  SizeComputer::SizeComputer((SizeComputer *)args_1_00);
  SerializeMany<SizeComputer,CompactSizeWriter,Span<unsigned_char_const>>
            ((SizeComputer *)in_RDX,in_stack_ffffffffffffffd0,args_1_00);
  SizeComputer::size((SizeComputer *)args_1_00);
  WriteCompactSize<DataStream>(in_RDX,(uint64_t)in_RDI);
  SerializeMany<DataStream,CompactSizeWriter,Span<unsigned_char_const>>(in_RDX,in_RDI,args_1_00);
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_10.m_size) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}